

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

int __thiscall Path::rename(Path *this,char *__old,char *__new)

{
  Type TVar1;
  int iVar2;
  undefined8 uVar3;
  anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1 local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  Log local_b8;
  Log local_a8;
  Log local_98;
  Log local_88;
  Log local_78;
  Log local_68;
  Log local_58;
  Log local_48;
  Log local_38;
  Log local_28;
  
  TVar1 = type(this);
  if ((TVar1 == File) || (TVar1 = type(this), TVar1 == Directory)) {
    iVar2 = ::rename((this->super_String).mString._M_dataplus._M_p,*(char **)__old);
    if (iVar2 == 0) {
      uVar3 = std::__cxx11::string::_M_assign((string *)this);
      return (int)CONCAT71((int7)((ulong)uVar3 >> 8),1);
    }
    local_c8.mValue = 1;
    Log::Log(&local_48,LogLevel::Error,(Flags<LogOutput::LogFlag> *)&local_c8);
    Log::write(&local_88,(int)&local_48,"Can\'t rename ",0xffffffff);
    Log::write((Log *)&local_c8,(int)&local_88,(this->super_String).mString._M_dataplus._M_p,
               (ulong)(uint)(this->super_String).mString._M_string_length);
    if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
    }
    Log::Log(&local_98,&local_88);
    Log::write(&local_78,(int)&local_98," to ",0xffffffff);
    Log::write((Log *)&local_c8,(int)&local_78,*(void **)__old,(ulong)*(uint *)(__old + 8));
    if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
    }
    Log::Log(&local_b8,&local_78);
    Log::write(&local_a8,(int)&local_b8,": errno=",0xffffffff);
    __errno_location();
    Log::addStringStream<int>(&local_38,(int)&local_a8);
    if (local_38.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_a8.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_b8.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_78.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_98.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_98.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_48.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_88.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      local_98.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_48.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
    }
  }
  else {
    local_c8.mValue = 1;
    Log::Log(&local_98,LogLevel::Error,(Flags<LogOutput::LogFlag> *)&local_c8);
    Log::write(&local_68,(int)&local_98,"Can\'t rename ",0xffffffff);
    Log::write((Log *)&local_c8,(int)&local_68,(this->super_String).mString._M_dataplus._M_p,
               (ulong)(uint)(this->super_String).mString._M_string_length);
    if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
    }
    Log::Log(&local_b8,&local_68);
    Log::write(&local_58,(int)&local_b8," to ",0xffffffff);
    Log::write((Log *)&local_c8,(int)&local_58,*(void **)__old,(ulong)*(uint *)(__old + 8));
    if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
    }
    Log::Log(&local_a8,&local_58);
    Log::write(&local_28,(int)&local_a8,": Not a file or directory.",0xffffffff);
    if (local_28.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_28.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_a8.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_58.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_b8.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_68.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  if (local_98.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return 0;
}

Assistant:

bool Path::rename(const Path &f_newName)
{
    if(type() != File && type() != Directory)
    {
        error() << "Can't rename " << *this << " to " << f_newName
                << ": Not a file or directory.";
        return false;
    }

#ifdef _WIN32
    if(f_newName.exists())
    {
        // on windows, rename() fails if the target exists.
        f_newName.rm();
    }

    int result = _wrename(Utf8To16(c_str()).asWchar_t(),
                          Utf8To16(f_newName.c_str()).asWchar_t());
#else
    int result = ::rename(c_str(), f_newName.c_str());
#endif

    if(result != 0)
    {
        error() << "Can't rename " << *this << " to " << f_newName
                << ": errno=" << errno;
        return false;
    }

    // rename was successful
    *this = f_newName;

    return true;
}